

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetch.hpp
# Opt level: O3

pair<boost::unit_test::basic_cstring<const_char>,_bool> *
boost::runtime::env::env_detail::sys_read_var
          (pair<boost::unit_test::basic_cstring<const_char>,_bool> *__return_storage_ptr__,
          cstring *var_name)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  
  pcVar2 = getenv(var_name->m_begin);
  if (pcVar2 == (char *)0x0) {
    lVar3 = 0;
    pcVar4 = "";
  }
  else {
    lVar3 = -1;
    do {
      lVar1 = lVar3 + 1;
      lVar3 = lVar3 + 1;
      pcVar4 = pcVar2;
    } while (pcVar2[lVar1] != '\0');
  }
  (__return_storage_ptr__->first).m_begin = pcVar4;
  (__return_storage_ptr__->first).m_end = pcVar4 + lVar3;
  __return_storage_ptr__->second = pcVar2 != (char *)0x0;
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<cstring,bool>
sys_read_var( cstring var_name )
{
    using namespace std;
    char const* res = getenv( var_name.begin() );

    return std::make_pair( cstring(res), res != NULL );
}